

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

iterator * __thiscall
idx2::Insert<short,idx2::bitstream>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<short,_idx2::bitstream> *Ht,
          short *Key,bitstream *Val)

{
  undefined8 *puVar1;
  short sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  
  if (7L << ((byte)this[0x20] & 0x3f) <= *(long *)(this + 0x18) * 10) {
    IncreaseCapacity<short,idx2::bitstream>((hash_table<short,_idx2::bitstream> *)this);
  }
  sVar2 = *(short *)&Ht->Keys;
  uVar12 = (ulong)((long)sVar2 * -0x61c8864680b583eb) >>
           (-(byte)*(undefined8 *)(this + 0x20) & 0x3f);
  if (*(char *)(*(long *)(this + 0x10) + uVar12) == '\x02') {
    do {
      if (*(short *)(*(long *)this + uVar12 * 2) == sVar2) break;
      uVar12 = uVar12 + 1 & ~(-1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f));
    } while (*(char *)(*(long *)(this + 0x10) + uVar12) == '\x02');
  }
  *(short *)(*(long *)this + uVar12 * 2) = sVar2;
  lVar3 = *(long *)(this + 8);
  lVar11 = uVar12 * 0x30;
  uVar4 = *(undefined8 *)Key;
  uVar5 = *(undefined8 *)(Key + 4);
  uVar6 = *(undefined8 *)(Key + 8);
  uVar7 = *(undefined8 *)(Key + 0xc);
  uVar8 = *(undefined8 *)(Key + 10);
  uVar9 = *(undefined8 *)(Key + 0xe);
  uVar10 = *(undefined8 *)(Key + 0x12);
  puVar1 = (undefined8 *)(lVar3 + 0xc + lVar11);
  *puVar1 = *(undefined8 *)(Key + 6);
  puVar1[1] = uVar8;
  puVar1[2] = uVar9;
  puVar1[3] = uVar10;
  puVar1 = (undefined8 *)(lVar3 + lVar11);
  *puVar1 = uVar4;
  puVar1[1] = uVar5;
  puVar1[2] = uVar6;
  puVar1[3] = uVar7;
  if (*(char *)(*(long *)(this + 0x10) + uVar12) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + uVar12) = 2;
  }
  __return_storage_ptr__->Key = (short *)(uVar12 * 2 + *(long *)this);
  __return_storage_ptr__->Val = (bitstream *)(lVar11 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<short,_idx2::bitstream> *)this;
  __return_storage_ptr__->Idx = uVar12;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}